

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

word Gia_LutComputeTruth6Map_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vMap)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  word wVar3;
  word wVar4;
  ulong uVar5;
  ulong uVar6;
  
  pObj = Gia_ManObj(p,iObj);
  if ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0) {
    wVar3 = 0;
  }
  else {
    uVar1 = (uint)*(ulong *)pObj;
    if ((~uVar1 & 0x9fffffff) == 0) {
      iVar2 = Gia_ObjCioId(pObj);
      iVar2 = Vec_IntEntry(vMap,iVar2);
      wVar3 = s_Truths6[iVar2];
    }
    else {
      wVar3 = Gia_LutComputeTruth6Map_rec(p,iObj - (uVar1 & 0x1fffffff),vMap);
      wVar4 = Gia_LutComputeTruth6Map_rec(p,iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff),vMap);
      uVar6 = (long)((int)*(long *)pObj * 4 >> 0x1f) ^ wVar3;
      uVar5 = (*(long *)pObj << 2) >> 0x3f ^ wVar4;
      iVar2 = Gia_ObjIsXor(pObj);
      wVar3 = uVar5 & uVar6;
      if (iVar2 != 0) {
        wVar3 = uVar6 ^ uVar5;
      }
    }
  }
  return wVar3;
}

Assistant:

word Gia_LutComputeTruth6Map_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vMap )
{
    word Truth0, Truth1, Truth;
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( Gia_ObjIsConst0(pObj) )
        return 0;
    if ( Gia_ObjIsCi(pObj) )
        return s_Truths6[Vec_IntEntry(vMap, Gia_ObjCioId(pObj))];
    Truth0 = Gia_LutComputeTruth6Map_rec( p, Gia_ObjFaninId0(pObj, iObj), vMap );
    Truth1 = Gia_LutComputeTruth6Map_rec( p, Gia_ObjFaninId1(pObj, iObj), vMap );
    Truth0 = Gia_ObjFaninC0(pObj) ? ~Truth0 : Truth0;
    Truth1 = Gia_ObjFaninC1(pObj) ? ~Truth1 : Truth1;
    Truth  = Gia_ObjIsXor(pObj) ? Truth0 ^ Truth1 : Truth0 & Truth1;
    return Truth;
}